

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * QString::fromUtf16(QString *__return_storage_ptr__,char16_t *unicode,qsizetype size)

{
  long in_FS_OFFSET;
  QByteArrayView in;
  QStringDecoder local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (unicode == (char16_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    if (size < 0) {
      size = QtPrivate::qustrlen(unicode);
    }
    local_58.super_QStringConverter.iface = QStringConverter::encodingInterfaces + 1;
    local_58.super_QStringConverter.state.flags.
    super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_58.super_QStringConverter.state._4_8_ = 0;
    local_58.super_QStringConverter.state._12_8_ = 0;
    local_58.super_QStringConverter.state._20_8_ = 0;
    local_58.super_QStringConverter.state.field_4.state_data[1] = 0;
    local_58.super_QStringConverter.state.field_4.state_data[2] = 0;
    local_58.super_QStringConverter.state.field_4.state_data[3] = 0;
    local_58.super_QStringConverter.state.clearFn = (ClearDataFn)0x0;
    in.m_data = (storage_type *)unicode;
    in.m_size = size * 2;
    QStringDecoder::decodeAsString(__return_storage_ptr__,&local_58,in);
    QStringConverterBase::State::clear(&local_58.super_QStringConverter.state);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromUtf16(const char16_t *unicode, qsizetype size)
{
    if (!unicode)
        return QString();
    if (size < 0)
        size = QtPrivate::qustrlen(unicode);
    QStringDecoder toUtf16(QStringDecoder::Utf16, QStringDecoder::Flag::Stateless);
    return toUtf16(QByteArrayView(reinterpret_cast<const char *>(unicode), size * 2));
}